

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O2

MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur,H264dCurStream_t *p_strm,H264dDxvaCtx_t *dxva_ctx)

{
  RK_U8 *pRVar1;
  int iVar2;
  RK_U8 *pRVar3;
  h264d_input_ctx_t *phVar4;
  MPP_RET MVar5;
  uint uVar6;
  uint uVar7;
  MPP_RET MVar8;
  undefined8 uVar9;
  uint add_size;
  RK_U32 RVar10;
  
  uVar7 = p_strm->nalu_type;
  if ((uVar7 < 0x15) && ((0x10c1e2U >> (uVar7 & 0x1f) & 1) != 0)) {
    uVar7 = 0x3200;
    if (p_strm->nalu_len < 0x3200) {
      uVar7 = p_strm->nalu_len;
    }
    add_size = uVar7 + 8;
    if (((ulong)p_strm->tmp_offset != 0) && (p_strm->head_offset == 0)) {
      memcpy(p_strm->head_buf,p_strm->tmp_buf,(ulong)p_strm->tmp_offset);
      p_strm->head_offset = p_strm->head_offset + p_strm->tmp_offset;
      p_strm->tmp_offset = 0;
      if (((byte)h264d_debug & 8) != 0) {
        _mpp_log_l(4,"h264d_parse","copy tmp header to empty header of new frame",(char *)0x0);
      }
    }
    uVar6 = p_strm->head_offset;
    if (uVar6 + add_size < p_strm->head_max_size) {
LAB_00186251:
      pRVar3 = p_strm->head_buf;
      pRVar1 = pRVar3 + uVar6;
      pRVar1[0] = '\0';
      pRVar1[1] = '\0';
      *(short *)(pRVar1 + 2) = (short)p_strm->nalu_type;
      *(uint *)(pRVar1 + 4) = uVar7;
      memcpy(pRVar1 + 8,p_strm->nalu_buf,(ulong)uVar7);
      p_strm->head_offset = p_strm->head_offset + add_size;
      if (((byte)h264d_debug & 8) != 0) {
        _mpp_log_l(4,"h264d_parse","store current header, NAL type %d",(char *)0x0,
                   (ulong)(uint)p_strm->nalu_type);
      }
      uVar7 = p_strm->nalu_type;
      if ((p_Cur->p_Dec->have_slice_data != '\0') && ((uVar7 | 4) != 5)) {
        uVar7 = p_strm->tmp_offset;
        if (p_strm->tmp_max_size <= uVar7 + add_size) {
          MVar5 = realloc_buffer(&p_strm->tmp_buf,&p_strm->tmp_max_size,add_size);
          if (MVar5 < MPP_OK) {
            if (((byte)h264d_debug & 4) == 0) {
              return MVar5;
            }
            uVar9 = 0x1a5;
            goto LAB_0018652a;
          }
          uVar7 = p_strm->tmp_offset;
        }
        memcpy(p_strm->tmp_buf + uVar7,pRVar3 + uVar6,(ulong)add_size);
        p_strm->tmp_offset = p_strm->tmp_offset + add_size;
        uVar7 = p_strm->nalu_type;
        if (((byte)h264d_debug & 8) != 0) {
          _mpp_log_l(4,"h264d_parse","store current header to tmp header, NAL type %d",(char *)0x0);
          uVar7 = p_strm->nalu_type;
        }
      }
      goto LAB_001862cc;
    }
    MVar5 = realloc_buffer(&p_strm->head_buf,&p_strm->head_max_size,add_size);
    if (MPP_NOK < MVar5) {
      uVar6 = p_strm->head_offset;
      goto LAB_00186251;
    }
    if (((byte)h264d_debug & 4) == 0) {
      return MVar5;
    }
    uVar9 = 0x194;
LAB_0018652a:
    _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,uVar9);
  }
  else {
LAB_001862cc:
    if ((uVar7 | 4) == 5) {
      uVar7 = dxva_ctx->strm_offset;
      RVar10 = p_strm->nalu_len + 3;
      if (dxva_ctx->max_strm_size <= uVar7 + p_strm->nalu_len + 3) {
        MVar5 = realloc_buffer(&dxva_ctx->bitstream,&dxva_ctx->max_strm_size,RVar10);
        if (MVar5 < MPP_OK) {
          if (((byte)h264d_debug & 4) == 0) {
            return MVar5;
          }
          uVar9 = 0x1b5;
          goto LAB_0018652a;
        }
        uVar7 = dxva_ctx->strm_offset;
      }
      pRVar1 = dxva_ctx->bitstream + uVar7;
      pRVar1[0] = '\0';
      pRVar1[1] = '\0';
      pRVar1[2] = '\x01';
      memcpy(pRVar1 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
      dxva_ctx->strm_offset = dxva_ctx->strm_offset + RVar10;
    }
    if (((p_Cur->p_Dec->cfg->base).enable_hdr_meta != 0) && (p_strm->nalu_type == 0x1c)) {
      mpp_h264d_fill_dynamic_meta(p_Cur,p_strm->nalu_buf + 2,p_strm->nalu_len - 2,0xb);
    }
    MVar8 = MPP_OK;
    MVar5 = MPP_OK;
    if ((h264d_debug._2_1_ & 1) != 0) {
      phVar4 = p_Cur->p_Inp;
      iVar2 = p_strm->nalu_type;
      MVar5 = MVar8;
      if (iVar2 - 7U < 2) {
        if (phVar4->spspps_update_flag != 0) {
          pRVar1 = phVar4->spspps_buf + phVar4->spspps_offset;
          pRVar1[0] = '\0';
          pRVar1[1] = '\0';
          pRVar1[2] = '\x01';
          memcpy(pRVar1 + 3,p_strm->nalu_buf,(ulong)p_strm->nalu_len);
          RVar10 = p_strm->nalu_len + phVar4->spspps_offset + 3;
          phVar4->spspps_offset = RVar10;
          phVar4->spspps_len = RVar10;
        }
      }
      else if ((iVar2 == 1) || (iVar2 == 5)) {
        phVar4->spspps_offset = 0;
        phVar4->spspps_update_flag = 1;
      }
    }
  }
  return MVar5;
}

Assistant:

static MPP_RET store_cur_nalu(H264dCurCtx_t *p_Cur, H264dCurStream_t *p_strm, H264dDxvaCtx_t *dxva_ctx)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U8 *p_des = NULL;

    //!< fill head buffer
    if (   (p_strm->nalu_type == H264_NALU_TYPE_SLICE)
           || (p_strm->nalu_type == H264_NALU_TYPE_IDR)
           || (p_strm->nalu_type == H264_NALU_TYPE_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_PPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SUB_SPS)
           || (p_strm->nalu_type == H264_NALU_TYPE_SEI)
           || (p_strm->nalu_type == H264_NALU_TYPE_PREFIX)
           || (p_strm->nalu_type == H264_NALU_TYPE_SLC_EXT)) {

        RK_U32 head_size = MPP_MIN(HEAD_SYNTAX_MAX_SIZE, p_strm->nalu_len);
        RK_U32 add_size = head_size + sizeof(H264dNaluHead_t);

        //!< judge new frame
        if (p_strm->tmp_offset && !p_strm->head_offset) {
            memcpy(p_strm->head_buf, p_strm->tmp_buf, p_strm->tmp_offset);
            p_strm->head_offset += p_strm->tmp_offset;
            p_strm->tmp_offset = 0;

            H264D_LOG("copy tmp header to empty header of new frame");
        }

        if ((p_strm->head_offset + add_size) >= p_strm->head_max_size) {
            FUN_CHECK(ret = realloc_buffer(&p_strm->head_buf, &p_strm->head_max_size, add_size));
        }
        p_des = &p_strm->head_buf[p_strm->head_offset];
        ((H264dNaluHead_t *)p_des)->is_frame_end  = 0;
        ((H264dNaluHead_t *)p_des)->nalu_type = p_strm->nalu_type;
        ((H264dNaluHead_t *)p_des)->sodb_len = head_size;
        memcpy(p_des + sizeof(H264dNaluHead_t), p_strm->nalu_buf, head_size);
        p_strm->head_offset += add_size;

        H264D_LOG("store current header, NAL type %d", p_strm->nalu_type);

        // store NAL header except slice NAL
        if (p_Cur->p_Dec->have_slice_data && p_strm->nalu_type != H264_NALU_TYPE_IDR &&
            p_strm->nalu_type != H264_NALU_TYPE_SLICE) {
            RK_U8 *p_tmp = NULL;

            if ((p_strm->tmp_offset + add_size) >= p_strm->tmp_max_size) {
                FUN_CHECK(ret = realloc_buffer(&p_strm->tmp_buf, &p_strm->tmp_max_size, add_size));
            }

            p_tmp = &p_strm->tmp_buf[p_strm->tmp_offset];
            memcpy(p_tmp, p_des, add_size);
            p_strm->tmp_offset += add_size;

            H264D_LOG("store current header to tmp header, NAL type %d", p_strm->nalu_type);
        }
    }    //!< fill sodb buffer
    if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
        || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {

        RK_U32 add_size = p_strm->nalu_len + sizeof(g_start_precode);

        if ((dxva_ctx->strm_offset + add_size) >= dxva_ctx->max_strm_size) {
            FUN_CHECK(ret = realloc_buffer(&dxva_ctx->bitstream, &dxva_ctx->max_strm_size, add_size));
        }

        p_des = &dxva_ctx->bitstream[dxva_ctx->strm_offset];
        memcpy(p_des, g_start_precode, sizeof(g_start_precode));
        memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
        dxva_ctx->strm_offset += add_size;
    }

    /* Dolby Vision RPUs masquerade as unregistered NALs of type 28. */
    if (p_Cur->p_Dec->cfg->base.enable_hdr_meta && p_strm->nalu_type == H264_NALU_TYPE_UNSPECIFIED28)
        mpp_h264d_fill_dynamic_meta(p_Cur, p_strm->nalu_buf + 2, p_strm->nalu_len - 2, DOLBY);

    if (h264d_debug & H264D_DBG_WRITE_ES_EN) {
        H264dInputCtx_t *p_Inp = p_Cur->p_Inp;
        if ((p_strm->nalu_type == H264_NALU_TYPE_SPS)
            || (p_strm->nalu_type == H264_NALU_TYPE_PPS)) {
            if (p_Inp->spspps_update_flag) {
                p_des = &p_Inp->spspps_buf[p_Inp->spspps_offset];
                memcpy(p_des, g_start_precode, sizeof(g_start_precode));
                memcpy(p_des + sizeof(g_start_precode), p_strm->nalu_buf, p_strm->nalu_len);
                p_Inp->spspps_offset += p_strm->nalu_len + sizeof(g_start_precode);
                p_Inp->spspps_len = p_Inp->spspps_offset;
            }
        } else if ((p_strm->nalu_type == H264_NALU_TYPE_SLICE)
                   || (p_strm->nalu_type == H264_NALU_TYPE_IDR)) {
            p_Cur->p_Inp->spspps_update_flag = 1;
            p_Inp->spspps_offset = 0;
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}